

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::~QStringBuilder
          (QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *this)

{
  ProString::~ProString((ProString *)0x13cc80);
  QStringBuilder<ProString,_const_char_(&)[2]>::~QStringBuilder
            ((QStringBuilder<ProString,_const_char_(&)[2]> *)0x13cc8a);
  return;
}

Assistant:

~QStringBuilder() = default;